

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cconv.c
# Opt level: O0

void lj_cconv_ct_init(CTState *cts,CType *d,CTSize sz,uint8_t *dp,TValue *o,MSize len)

{
  int iVar1;
  MSize len_local;
  TValue *o_local;
  uint8_t *dp_local;
  CTSize sz_local;
  CType *d_local;
  CTState *cts_local;
  
  if (len == 0) {
    memset(dp,0,(ulong)sz);
  }
  else if ((len == 1) && (iVar1 = lj_cconv_multi_init(cts,d,o), iVar1 == 0)) {
    lj_cconv_ct_tv(cts,d,dp,o,0);
  }
  else if (d->info >> 0x1c == 3) {
    cconv_array_init(cts,d,sz,dp,o,len);
  }
  else {
    if (d->info >> 0x1c != 1) {
      cconv_err_initov(cts,d);
    }
    cconv_struct_init(cts,d,sz,dp,o,len);
  }
  return;
}

Assistant:

void lj_cconv_ct_init(CTState *cts, CType *d, CTSize sz,
		      uint8_t *dp, TValue *o, MSize len)
{
  if (len == 0)
    memset(dp, 0, sz);
  else if (len == 1 && !lj_cconv_multi_init(cts, d, o))
    lj_cconv_ct_tv(cts, d, dp, o, 0);
  else if (ctype_isarray(d->info))  /* Also handles valarray init with len>1. */
    cconv_array_init(cts, d, sz, dp, o, len);
  else if (ctype_isstruct(d->info))
    cconv_struct_init(cts, d, sz, dp, o, len);
  else
    cconv_err_initov(cts, d);
}